

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TAPReporter::testRunEnded(TAPReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  uint64_t uVar2;
  TestRunStats *_testRunStats_local;
  TAPReporter *this_local;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"1..");
  uVar2 = Counts::total(&(_testRunStats->totals).assertions);
  std::ostream::operator<<(poVar1,uVar2);
  uVar2 = Counts::total(&(_testRunStats->totals).testCases);
  if (uVar2 == 0) {
    std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                    " # Skipped: No tests ran.");
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"\n\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

void TAPReporter::testRunEnded(TestRunStats const& _testRunStats) {
        m_stream << "1.." << _testRunStats.totals.assertions.total();
        if (_testRunStats.totals.testCases.total() == 0) {
            m_stream << " # Skipped: No tests ran.";
        }
        m_stream << "\n\n" << std::flush;
        StreamingReporterBase::testRunEnded(_testRunStats);
    }